

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

ktx_error_code_e
ktxPrintKTX2InfoJSONForStdioStream
          (FILE *stdioStream,ktx_uint32_t base_indent,ktx_uint32_t indent_width,_Bool minified)

{
  ktx_error_code_e kVar1;
  ktxStream stream;
  
  if (stdioStream != (FILE *)0x0) {
    kVar1 = ktxFileStream_construct(&stream,stdioStream,false);
    if (kVar1 == KTX_SUCCESS) {
      kVar1 = ktxPrintKTX2InfoJSONForStream(&stream,base_indent,indent_width,minified);
    }
    return kVar1;
  }
  return KTX_INVALID_VALUE;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoJSONForStdioStream(FILE* stdioStream, ktx_uint32_t base_indent, ktx_uint32_t indent_width, bool minified)
{
    KTX_error_code result;
    ktxStream stream;

    if (stdioStream == NULL)
        return KTX_INVALID_VALUE;

    result = ktxFileStream_construct(&stream, stdioStream, KTX_FALSE);
    if (result == KTX_SUCCESS)
        result = ktxPrintKTX2InfoJSONForStream(&stream, base_indent, indent_width, minified);
    return result;
}